

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int uv_pipe_bind2(uv_pipe_t *handle,char *name,size_t namelen,uint flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  socklen_t local_b4;
  int local_b0;
  socklen_t addrlen;
  int err;
  int sockfd;
  char *pipe_fname;
  undefined1 auStack_98 [6];
  sockaddr_un saddr;
  uint flags_local;
  size_t namelen_local;
  char *name_local;
  uv_pipe_t *handle_local;
  
  _err = (char *)0x0;
  if ((flags & 0xfffffffe) == 0) {
    if (name == (char *)0x0) {
      handle_local._4_4_ = -0x16;
    }
    else if (namelen == 0) {
      handle_local._4_4_ = -0x16;
    }
    else {
      saddr.sun_path._100_4_ = flags;
      unique0x100001b5 = namelen;
      iVar1 = includes_nul(name,namelen);
      if (iVar1 == 0) {
        if (((saddr.sun_path._100_4_ & 1) == 0) || (stack0xffffffffffffffd8 < 0x6d)) {
          if (0x6c < stack0xffffffffffffffd8) {
            stack0xffffffffffffffd8 = 0x6c;
          }
          if ((handle->io_watcher).fd < 0) {
            if ((handle->flags & 3) == 0) {
              if (*name == '\0') {
                local_b4 = (int)stack0xffffffffffffffd8 + 2;
              }
              else {
                _err = (char *)uv__malloc(stack0xffffffffffffffd8 + 1);
                if (_err == (char *)0x0) {
                  return -0xc;
                }
                memcpy(_err,name,stack0xffffffffffffffd8);
                _err[stack0xffffffffffffffd8] = '\0';
                local_b4 = 0x6e;
              }
              iVar1 = uv__socket(1,1,0);
              local_b0 = iVar1;
              if (-1 < iVar1) {
                memset((void *)((long)&pipe_fname + 6),0,0x6e);
                memcpy(auStack_98,name,stack0xffffffffffffffd8);
                pipe_fname._6_2_ = 1;
                iVar2 = bind(iVar1,(sockaddr *)((long)&pipe_fname + 6),local_b4);
                if (iVar2 == 0) {
                  handle->flags = handle->flags | 0x2000;
                  handle->pipe_fname = _err;
                  (handle->io_watcher).fd = iVar1;
                  return 0;
                }
                piVar3 = __errno_location();
                local_b0 = -*piVar3;
                if (local_b0 == -2) {
                  local_b0 = -0xd;
                }
                uv__close(iVar1);
              }
              uv__free(_err);
              handle_local._4_4_ = local_b0;
            }
            else {
              handle_local._4_4_ = -0x16;
            }
          }
          else {
            handle_local._4_4_ = -0x16;
          }
        }
        else {
          handle_local._4_4_ = -0x16;
        }
      }
      else {
        handle_local._4_4_ = -0x16;
      }
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_bind2(uv_pipe_t* handle,
                  const char* name,
                  size_t namelen,
                  unsigned int flags) {
  struct sockaddr_un saddr;
  char* pipe_fname;
  int sockfd;
  int err;
  socklen_t addrlen;

  pipe_fname = NULL;

  if (flags & ~UV_PIPE_NO_TRUNCATE)
    return UV_EINVAL;

  if (name == NULL)
    return UV_EINVAL;

  if (namelen == 0)
    return UV_EINVAL;

  if (includes_nul(name, namelen))
    return UV_EINVAL;

  if (flags & UV_PIPE_NO_TRUNCATE)
    if (namelen > sizeof(saddr.sun_path))
      return UV_EINVAL;

  /* Truncate long paths. Documented behavior. */
  if (namelen > sizeof(saddr.sun_path))
    namelen = sizeof(saddr.sun_path);

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return UV_EINVAL;

  if (uv__is_closing(handle))
    return UV_EINVAL;

  /* Make a copy of the file path unless it is an abstract socket.
   * We unlink the file later but abstract sockets disappear
   * automatically since they're not real file system entities.
   */
  if (*name == '\0') {
    addrlen = offsetof(struct sockaddr_un, sun_path) + namelen;
  } else {
    pipe_fname = uv__malloc(namelen + 1);
    if (pipe_fname == NULL)
      return UV_ENOMEM;
    memcpy(pipe_fname, name, namelen);
    pipe_fname[namelen] = '\0';
    addrlen = sizeof saddr;
  }

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto err_socket;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  memcpy(&saddr.sun_path, name, namelen);
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, addrlen)) {
    err = UV__ERR(errno);
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == UV_ENOENT)
      err = UV_EACCES;

    uv__close(sockfd);
    goto err_socket;
  }

  /* Success. */
  handle->flags |= UV_HANDLE_BOUND;
  handle->pipe_fname = pipe_fname; /* NULL or a copy of |name| */
  handle->io_watcher.fd = sockfd;
  return 0;

err_socket:
  uv__free(pipe_fname);
  return err;
}